

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsVulkanStorageBuffer(Instruction *this)

{
  Op OVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  DefUseManager *pDVar4;
  DecorationManager *pDVar5;
  anon_class_8_1_ee6852b6 local_80;
  function<void_(const_spvtools::opt::Instruction_&)> local_78;
  bool local_51;
  anon_class_8_1_1bfefea3 aStack_50;
  bool is_block;
  function<void_(const_spvtools::opt::Instruction_&)> local_48;
  bool local_25;
  uint32_t local_24;
  bool is_buffer_block;
  Instruction *pIStack_20;
  StorageClass storage_class;
  Instruction *base_type;
  Instruction *this_local;
  
  base_type = this;
  OVar1 = opcode(this);
  if (OVar1 == OpTypePointer) {
    pIVar3 = context(this);
    pDVar4 = IRContext::get_def_use_mgr(pIVar3);
    uVar2 = GetSingleWordInOperand(this,1);
    pIStack_20 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
    OVar1 = opcode(pIStack_20);
    if ((OVar1 == OpTypeArray) || (OVar1 = opcode(pIStack_20), OVar1 == OpTypeRuntimeArray)) {
      pIVar3 = context(this);
      pDVar4 = IRContext::get_def_use_mgr(pIVar3);
      uVar2 = GetSingleWordInOperand(pIStack_20,0);
      pIStack_20 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
    }
    OVar1 = opcode(pIStack_20);
    if (OVar1 == OpTypeStruct) {
      local_24 = GetSingleWordInOperand(this,0);
      if (local_24 == 2) {
        local_25 = false;
        pIVar3 = context(this);
        pDVar5 = IRContext::get_decoration_mgr(pIVar3);
        uVar2 = result_id(pIStack_20);
        aStack_50.is_buffer_block = &local_25;
        std::function<void(spvtools::opt::Instruction_const&)>::
        function<spvtools::opt::Instruction::IsVulkanStorageBuffer()const::__0,void>
                  ((function<void(spvtools::opt::Instruction_const&)> *)&local_48,
                   &stack0xffffffffffffffb0);
        analysis::DecorationManager::ForEachDecoration(pDVar5,uVar2,3,&local_48);
        std::function<void_(const_spvtools::opt::Instruction_&)>::~function(&local_48);
        this_local._7_1_ = (bool)(local_25 & 1);
      }
      else if (local_24 == 0xc) {
        local_51 = false;
        pIVar3 = context(this);
        pDVar5 = IRContext::get_decoration_mgr(pIVar3);
        uVar2 = result_id(pIStack_20);
        local_80.is_block = &local_51;
        std::function<void(spvtools::opt::Instruction_const&)>::
        function<spvtools::opt::Instruction::IsVulkanStorageBuffer()const::__1,void>
                  ((function<void(spvtools::opt::Instruction_const&)> *)&local_78,&local_80);
        analysis::DecorationManager::ForEachDecoration(pDVar5,uVar2,2,&local_78);
        std::function<void_(const_spvtools::opt::Instruction_&)>::~function(&local_78);
        this_local._7_1_ = (bool)(local_51 & 1);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  return false;
}

Assistant:

bool Instruction::IsVulkanStorageBuffer() const {
  // Is there a difference between a "Storage buffer" and a "dynamic storage
  // buffer" in SPIR-V and do we care about the difference?
  if (opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  Instruction* base_type =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(1));

  // Unpack the optional layer of arraying.
  if (base_type->opcode() == spv::Op::OpTypeArray ||
      base_type->opcode() == spv::Op::OpTypeRuntimeArray) {
    base_type = context()->get_def_use_mgr()->GetDef(
        base_type->GetSingleWordInOperand(0));
  }

  if (base_type->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kPointerTypeStorageClassIndex));
  if (storage_class == spv::StorageClass::Uniform) {
    bool is_buffer_block = false;
    context()->get_decoration_mgr()->ForEachDecoration(
        base_type->result_id(), uint32_t(spv::Decoration::BufferBlock),
        [&is_buffer_block](const Instruction&) { is_buffer_block = true; });
    return is_buffer_block;
  } else if (storage_class == spv::StorageClass::StorageBuffer) {
    bool is_block = false;
    context()->get_decoration_mgr()->ForEachDecoration(
        base_type->result_id(), uint32_t(spv::Decoration::Block),
        [&is_block](const Instruction&) { is_block = true; });
    return is_block;
  }
  return false;
}